

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

void __thiscall
ktx::
Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
::Combine(Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
          *this)

{
  int iVar1;
  
  (this->super_OptionsCreate)._1d = false;
  (this->super_OptionsCreate).cubemap = false;
  *(undefined8 *)&(this->super_OptionsCreate).vkFormat = 0;
  *(undefined8 *)&(this->super_OptionsCreate).formatDesc.basic.field_0x4 = 0;
  *(undefined8 *)&(this->super_OptionsCreate).formatDesc.basic.field_0x5 = 0;
  *(undefined8 *)&(this->super_OptionsCreate).formatDesc.basic.field_0xd = 0;
  (this->super_OptionsCreate).formatDesc.extended.oeGamma = -1.0;
  (this->super_OptionsCreate).formatDesc.extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&(this->super_OptionsCreate).formatDesc.extended.iccProfile.name.field_2;
  (this->super_OptionsCreate).formatDesc.extended.iccProfile.name._M_string_length = 0;
  (this->super_OptionsCreate).formatDesc.extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsCreate).width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsCreate).height.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsCreate).depth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsCreate).layers.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsCreate).levels.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsCreate).mipmapRuntime = false;
  (this->super_OptionsCreate).mipmapGenerate = false;
  (this->super_OptionsCreate).mipmapFilter.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_OptionsCreate).formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_OptionsCreate).formatDesc.extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_OptionsCreate).formatDesc.extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10) =
       (pointer)0x0;
  (this->super_OptionsCreate).formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_OptionsCreate).formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_OptionsCreate).formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_OptionsCreate).raw = false;
  (this->super_OptionsCreate).defaultMipmapFilter._M_dataplus._M_p =
       (pointer)&(this->super_OptionsCreate).defaultMipmapFilter.field_2;
  (this->super_OptionsCreate).defaultMipmapFilter.field_2._M_allocated_capacity = 0x34736f7a636e616c
  ;
  (this->super_OptionsCreate).defaultMipmapFilter._M_string_length = 8;
  (this->super_OptionsCreate).defaultMipmapFilter.field_2._M_local_buf[8] = '\0';
  (this->super_OptionsCreate).mipmapFilterScale.super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float>._M_engaged = false;
  (this->super_OptionsCreate).defaultMipmapFilterScale = 1.0;
  (this->super_OptionsCreate).mipmapWrap.
  super__Optional_base<basisu::Resampler::Boundary_Op,_true,_true>._M_payload.
  super__Optional_payload_base<basisu::Resampler::Boundary_Op>._M_engaged = false;
  (this->super_OptionsCreate).defaultMipmapWrap = BOUNDARY_WRAP;
  (this->super_OptionsCreate).swizzle.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_OptionsCreate).swizzleInput.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_OptionsCreate).imageScale.super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float>._M_engaged = false;
  (this->super_OptionsCreate).convertTF.super__Optional_base<_khr_df_transfer_e,_true,_true>.
  _M_payload.super__Optional_payload_base<_khr_df_transfer_e>._M_engaged = false;
  (this->super_OptionsCreate).assignTF.super__Optional_base<_khr_df_transfer_e,_true,_true>.
  _M_payload.super__Optional_payload_base<_khr_df_transfer_e>._M_engaged = false;
  (this->super_OptionsCreate).assignPrimaries.super__Optional_base<_khr_df_primaries_e,_true,_true>.
  _M_payload.super__Optional_payload_base<_khr_df_primaries_e>._M_engaged = false;
  (this->super_OptionsCreate).convertPrimaries.super__Optional_base<_khr_df_primaries_e,_true,_true>
  ._M_payload.super__Optional_payload_base<_khr_df_primaries_e>._M_engaged = false;
  (this->super_OptionsCreate).assignTexcoordOrigin.
  super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
  super__Optional_payload_base<ImageSpec::Origin>._M_engaged = false;
  *(undefined4 *)
   &(this->super_OptionsCreate).convertTexcoordOrigin.
    super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
    super__Optional_payload_base<ImageSpec::Origin>._M_engaged = 0;
  (this->super_OptionsCreate).noWarnOnColorConversions = false;
  (this->super_OptionsCreate).failOnOriginChanges = false;
  (this->super_OptionsCreate).warnOnOriginChanges = false;
  (this->super_OptionsCreate).normalize = false;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.mode = 0;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.qualityLevel = 0;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.normalMap = false;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.perceptual = false;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[0] = '\0';
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[1] = '\0';
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[2] = '\0';
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[3] = '\0';
  *(undefined2 *)&(this->super_OptionsEncodeASTC).super_ktxAstcParams.field_0x1e = 0;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.structSize = 0;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.verbose = false;
  *(undefined3 *)&(this->super_OptionsEncodeASTC).super_ktxAstcParams.field_0x5 = 0;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.threadCount = 0;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.blockDimension = 0;
  (this->super_OptionsEncodeASTC).astcOptions._M_dataplus._M_p =
       (pointer)&(this->super_OptionsEncodeASTC).astcOptions.field_2;
  (this->super_OptionsEncodeASTC).astcOptions._M_string_length = 0;
  (this->super_OptionsEncodeASTC).astcOptions.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsEncodeASTC).encodeASTC = false;
  (this->super_OptionsEncodeASTC).qualityLevel.option =
       &(this->super_OptionsEncodeASTC).super_ktxAstcParams.qualityLevel;
  (this->super_OptionsEncodeASTC).qualityLevel.min = 0;
  (this->super_OptionsEncodeASTC).qualityLevel.max = 100;
  iVar1 = std::thread::hardware_concurrency();
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.threadCount = iVar1 + (uint)(iVar1 == 0);
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.structSize = 0x20;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.normalMap = false;
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[0] = '\0';
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[1] = '\0';
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[2] = '\0';
  (this->super_OptionsEncodeASTC).super_ktxAstcParams.inputSwizzle[3] = '\0';
  *(this->super_OptionsEncodeASTC).qualityLevel.option = 0;
  OptionsEncodeBasis<false>::OptionsEncodeBasis(&this->super_OptionsEncodeBasis<false>);
  (this->super_OptionsEncodeCommon).commonOptions._M_dataplus._M_p =
       (pointer)&(this->super_OptionsEncodeCommon).commonOptions.field_2;
  (this->super_OptionsEncodeCommon).commonOptions._M_string_length = 0;
  (this->super_OptionsEncodeCommon).commonOptions.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsEncodeCommon).normalMap = false;
  (this->super_OptionsEncodeCommon).threadCount = 1;
  iVar1 = std::thread::hardware_concurrency();
  (this->super_OptionsEncodeCommon).threadCount = iVar1 + (uint)(iVar1 == 0);
  (this->super_OptionsEncodeCommon).noSSE = false;
  (this->super_OptionsDeflate).compressOptions._M_dataplus._M_p =
       (pointer)&(this->super_OptionsDeflate).compressOptions.field_2;
  (this->super_OptionsDeflate).compressOptions._M_string_length = 0;
  (this->super_OptionsDeflate).compressOptions.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsDeflate).zstd.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsDeflate).zlib.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_OptionsMultiInSingleOut).inputFilepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_OptionsMultiInSingleOut).inputFilepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_OptionsMultiInSingleOut).inputFilepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_OptionsMultiInSingleOut).outputFilepath._M_dataplus._M_p =
       (pointer)&(this->super_OptionsMultiInSingleOut).outputFilepath.field_2;
  (this->super_OptionsMultiInSingleOut).outputFilepath._M_string_length = 0;
  (this->super_OptionsMultiInSingleOut).outputFilepath.field_2._M_local_buf[0] = '\0';
  (this->super_OptionsGeneric).testrun = false;
  return;
}

Assistant:

void init(cxxopts::Options& opts) {
        (Args::init(opts), ...);
    }